

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86.cpp
# Opt level: O1

int __thiscall ncnn::GELU_x86::forward_inplace(GELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_GELU_x86[-3]) == 0) {
    iVar7 = GELU::forward_inplace
                      ((GELU *)((long)&this->_vptr_GELU_x86 + (long)this->_vptr_GELU_x86[-3]),
                       bottom_top_blob,opt);
    return iVar7;
  }
  iVar7 = bottom_top_blob->c;
  if (0 < (long)iVar7) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->elempack;
    lVar9 = 0;
    do {
      pfVar10 = (float *)(bottom_top_blob->cstep * lVar9 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      if ((int)uVar8 < 4) {
        uVar6 = 0;
      }
      else {
        iVar5 = 3;
        do {
          fVar1 = *pfVar10;
          fVar12 = pfVar10[1];
          fVar3 = pfVar10[2];
          fVar4 = pfVar10[3];
          auVar17._0_4_ = (fVar1 * fVar1 * 0.044715 * fVar1 + fVar1) * 0.7978845;
          auVar17._4_4_ = (fVar12 * fVar12 * 0.044715 * fVar12 + fVar12) * 0.7978845;
          auVar17._8_4_ = (fVar3 * fVar3 * 0.044715 * fVar3 + fVar3) * 0.7978845;
          auVar17._12_4_ = (fVar4 * fVar4 * 0.044715 * fVar4 + fVar4) * 0.7978845;
          auVar18._8_4_ = 0xc1100000;
          auVar18._0_8_ = 0xc1100000c1100000;
          auVar18._12_4_ = 0xc1100000;
          auVar18 = maxps(auVar17,auVar18);
          auVar2._8_4_ = 0x41100000;
          auVar2._0_8_ = 0x4110000041100000;
          auVar2._12_4_ = 0x41100000;
          auVar18 = minps(auVar18,auVar2);
          fVar13 = auVar18._0_4_;
          fVar14 = auVar18._4_4_;
          fVar15 = auVar18._8_4_;
          fVar16 = auVar18._12_4_;
          auVar20._0_4_ = fVar13 * fVar13;
          auVar20._4_4_ = fVar14 * fVar14;
          auVar20._8_4_ = fVar15 * fVar15;
          auVar20._12_4_ = fVar16 * fVar16;
          fVar13 = ((((((auVar20._0_4_ * -2.7607684e-16 + 2.000188e-13) * auVar20._0_4_ +
                       -8.604672e-11) * auVar20._0_4_ + 5.1222973e-08) * auVar20._0_4_ +
                     1.48572235e-05) * auVar20._0_4_ + 0.00063726195) * auVar20._0_4_ + 0.0048935246
                   ) * fVar13;
          fVar14 = ((((((auVar20._4_4_ * -2.7607684e-16 + 2.000188e-13) * auVar20._4_4_ +
                       -8.604672e-11) * auVar20._4_4_ + 5.1222973e-08) * auVar20._4_4_ +
                     1.48572235e-05) * auVar20._4_4_ + 0.00063726195) * auVar20._4_4_ + 0.0048935246
                   ) * fVar14;
          fVar15 = ((((((auVar20._8_4_ * -2.7607684e-16 + 2.000188e-13) * auVar20._8_4_ +
                       -8.604672e-11) * auVar20._8_4_ + 5.1222973e-08) * auVar20._8_4_ +
                     1.48572235e-05) * auVar20._8_4_ + 0.00063726195) * auVar20._8_4_ + 0.0048935246
                   ) * fVar15;
          fVar16 = ((((((auVar20._12_4_ * -2.7607684e-16 + 2.000188e-13) * auVar20._12_4_ +
                       -8.604672e-11) * auVar20._12_4_ + 5.1222973e-08) * auVar20._12_4_ +
                     1.48572235e-05) * auVar20._12_4_ + 0.00063726195) * auVar20._12_4_ +
                   0.0048935246) * fVar16;
          auVar19._0_4_ =
               ((auVar20._0_4_ * 1.1982584e-06 + 0.00011853471) * auVar20._0_4_ + 0.0022684347) *
               auVar20._0_4_ + 0.0048935246;
          auVar19._4_4_ =
               ((auVar20._4_4_ * 1.1982584e-06 + 0.00011853471) * auVar20._4_4_ + 0.0022684347) *
               auVar20._4_4_ + 0.0048935246;
          auVar19._8_4_ =
               ((auVar20._8_4_ * 1.1982584e-06 + 0.00011853471) * auVar20._8_4_ + 0.0022684347) *
               auVar20._8_4_ + 0.0048935246;
          auVar19._12_4_ =
               ((auVar20._12_4_ * 1.1982584e-06 + 0.00011853471) * auVar20._12_4_ + 0.0022684347) *
               auVar20._12_4_ + 0.0048935246;
          auVar18 = rcpps(auVar20,auVar19);
          fVar21 = fVar13 * auVar18._0_4_;
          fVar22 = fVar14 * auVar18._4_4_;
          fVar23 = fVar15 * auVar18._8_4_;
          fVar24 = fVar16 * auVar18._12_4_;
          *pfVar10 = fVar1 * 0.5 *
                     ((fVar13 - auVar19._0_4_ * fVar21) * auVar18._0_4_ + fVar21 + 1.0);
          pfVar10[1] = fVar12 * 0.5 *
                       ((fVar14 - auVar19._4_4_ * fVar22) * auVar18._4_4_ + fVar22 + 1.0);
          pfVar10[2] = fVar3 * 0.5 *
                       ((fVar15 - auVar19._8_4_ * fVar23) * auVar18._8_4_ + fVar23 + 1.0);
          pfVar10[3] = fVar4 * 0.5 *
                       ((fVar16 - auVar19._12_4_ * fVar24) * auVar18._12_4_ + fVar24 + 1.0);
          pfVar10 = pfVar10 + 4;
          iVar5 = iVar5 + 4;
          uVar6 = uVar8 & 0xfffffffc;
        } while (iVar5 < (int)uVar8);
      }
      if (uVar8 - uVar6 != 0 && (int)uVar6 <= (int)uVar8) {
        lVar11 = 0;
        do {
          fVar1 = pfVar10[lVar11];
          fVar12 = tanhf((fVar1 * fVar1 * 0.044715 * fVar1 + fVar1) * 0.7978845);
          pfVar10[lVar11] = (fVar12 + 1.0) * fVar1 * 0.5;
          lVar11 = lVar11 + 1;
        } while (uVar8 - uVar6 != (int)lVar11);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar7);
  }
  return 0;
}

Assistant:

int GELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}